

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_objectwriter.cc
# Opt level: O3

JsonObjectWriter * __thiscall
google::protobuf::util::converter::JsonObjectWriter::EndList(JsonObjectWriter *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  Pop(this);
  WriteChar(this,']');
  iVar1 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x11])(this);
  if (*(long *)(CONCAT44(extraout_var,iVar1) + 8) == 0) {
    NewLine(this);
  }
  return this;
}

Assistant:

JsonObjectWriter* JsonObjectWriter::EndList() {
  Pop();
  WriteChar(']');
  if (element()->is_root()) NewLine();
  return this;
}